

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void ImportModuleVariables(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  uint offset;
  uint uniqueId;
  ByteCode *code;
  InplaceStr name_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ExternVarInfo *pEVar5;
  size_t sVar6;
  TypeBase *type;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  VariableData *pVVar7;
  ulong uVar8;
  InplaceStr name;
  VariableData *data;
  char *local_70;
  SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U> *local_68;
  SmallArray<VariableData_*,_128U> *local_60;
  ulong local_58;
  InplaceStr local_50;
  TraceScope traceScope;
  
  if ((ImportModuleVariables(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&ImportModuleVariables(ExpressionContext&,SynBase*,ModuleContext&)
                                   ::token), iVar2 != 0)) {
    ImportModuleVariables::token = NULLC::TraceGetToken("analyze","ImportModuleVariables");
    __cxa_guard_release(&ImportModuleVariables(ExpressionContext&,SynBase*,ModuleContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&traceScope,ImportModuleVariables::token);
  code = moduleCtx->data->bytecode;
  pcVar4 = FindSymbols(code);
  pEVar5 = FindFirstVar(code);
  local_60 = &ctx->vtables;
  local_68 = &ctx->vtableMap;
  uVar8 = 0;
  do {
    if (code->variableExportCount <= uVar8) {
      NULLC::TraceScope::~TraceScope(&traceScope);
      return;
    }
    pVVar7 = (VariableData *)(pcVar4 + pEVar5->offsetToName);
    name.begin = (char *)pVVar7;
    sVar6 = strlen((char *)pVVar7);
    name.end = (char *)((long)(pVVar7->users).little + (sVar6 - 0x58));
    if ((uint)sVar6 < 5) {
LAB_0017826e:
      local_58 = uVar8;
      type = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar5->type);
      if (type == (TypeBase *)0x0) {
        anon_unknown.dwarf_b837c::Stop
                  (ctx,source,"ERROR: can\'t find variable \'%s\' type in module %.*s",
                   pcVar4 + pEVar5->offsetToName,
                   (ulong)(uint)(*(int *)&(moduleCtx->data->name).end -
                                (int)(moduleCtx->data->name).begin));
      }
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      name_00.end._0_4_ = (int)name.end;
      name_00.begin = name.begin;
      name_00.end._4_4_ = name.end._4_4_;
      SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var,iVar2),name_00);
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
      pVVar7 = (VariableData *)CONCAT44(extraout_var_00,iVar3);
      offset = pEVar5->offset;
      uniqueId = ctx->uniqueVariableId;
      ctx->uniqueVariableId = uniqueId + 1;
      VariableData::VariableData
                (pVVar7,ctx->allocator,source,ctx->scope,0,type,
                 (SynIdentifier *)CONCAT44(extraout_var,iVar2),offset,uniqueId);
      pVVar7->importModule = moduleCtx->data;
      data = pVVar7;
      ExpressionContext::AddVariable(ctx,pVVar7,true);
      uVar8 = local_58;
      if (5 < (uint)((int)name.end - (int)name.begin)) {
        iVar2 = bcmp(name.begin,"$vtbl",5);
        uVar8 = local_58;
        if (iVar2 == 0) {
          SmallArray<VariableData_*,_128U>::push_back(local_60,&data);
          SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::insert
                    (local_68,&name,&data);
          uVar8 = local_58;
        }
      }
    }
    else {
      local_70 = (char *)((long)&pVVar7->source + 5);
      local_50.begin = "$temp";
      local_50.end = "";
      data = pVVar7;
      bVar1 = InplaceStr::operator==((InplaceStr *)&data,&local_50);
      if (!bVar1) goto LAB_0017826e;
    }
    uVar8 = uVar8 + 1;
    pEVar5 = pEVar5 + 1;
  } while( true );
}

Assistant:

void ImportModuleVariables(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleVariables");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	// Import variables
	ExternVarInfo *variableList = FindFirstVar(bCode);

	for(unsigned i = 0; i < bCode->variableExportCount; i++)
	{
		ExternVarInfo &variable = variableList[i];

		InplaceStr name = InplaceStr(symbols + variable.offsetToName);

		// Exclude temporary variables from import
		if(name.length() >= 5 && InplaceStr(name.begin, name.begin + 5) == InplaceStr("$temp"))
			continue;

		TypeBase *type = GetImportedModuleTypeAt(ctx, source, moduleCtx, variable.type);

		if(!type)
			Stop(ctx, source, "ERROR: can't find variable '%s' type in module %.*s", symbols + variable.offsetToName, FMT_ISTR(moduleCtx.data->name));

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(name);

		VariableData *data = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, type, nameIdentifier, variable.offset, ctx.uniqueVariableId++);

		data->importModule = moduleCtx.data;

		ctx.AddVariable(data, true);

		if(name.length() > 5 && memcmp(name.begin, "$vtbl", 5) == 0)
		{
			ctx.vtables.push_back(data);
			ctx.vtableMap.insert(name, data);
		}
	}
}